

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.cpp
# Opt level: O1

Graph create_graph(void)

{
  Graph graph;
  istream *piVar1;
  long *plVar2;
  int iVar3;
  ulong uVar4;
  char c;
  int end;
  int start;
  int length;
  char local_3d;
  int local_3c;
  int local_38;
  Type local_34;
  
  graph = (Graph)malloc(0x7a1230);
  uVar4 = 0;
  memset(graph->head,0,0x7a1228);
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)graph);
  std::istream::operator>>(piVar1,&graph->edge_num);
  if (0 < graph->edge_num) {
    do {
      iVar3 = (int)uVar4;
      piVar1 = std::operator>>((istream *)&std::cin,&local_3d);
      piVar1 = (istream *)std::istream::operator>>(piVar1,&local_38);
      piVar1 = (istream *)std::istream::operator>>(piVar1,&local_3c);
      std::istream::operator>>(piVar1,&local_34);
      add_edge(graph,local_38,local_3c,local_34);
      if ((int)(uVar4 / 200) * 200 == iVar3) {
        plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
        std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
        std::ostream::put((char)plVar2);
        std::ostream::flush();
      }
      uVar4 = (ulong)(iVar3 + 1U);
    } while ((int)(iVar3 + 1U) < graph->edge_num);
  }
  return graph;
}

Assistant:

Graph create_graph() {
    int length, start, end;
//    alloc the space gor graph
    Graph graph = (Graph) malloc(sizeof(struct _graph));
//    init the matrix
    for (int i = 0; i < MAX; ++i) {
        graph->head[i] = nullptr;
    }
//    read the numbers
    char c;
    cin >> graph->vertex_num >> graph->edge_num;
//    read each lines
    for (int i = 0; i < graph->edge_num; i++) {
        cin >> c >> start >> end >> length;
        add_edge(graph, start, end, length);
        if (i % 200 == 0) {
            cout << i << endl;
        }
    }
    return graph;
}